

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)59,(moira::Mode)6,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  Ea<(moira::Mode)6,_(moira::Size)1> *in_RDI;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  Dn src;
  Align align;
  u32 *in_stack_ffffffffffffffd0;
  u16 in_stack_ffffffffffffffde;
  Dn in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  Dn::Dn((Dn *)&stack0xffffffffffffffe0,(int)(uint)in_CX >> 9 & 7);
  Op<(moira::Mode)6,(moira::Size)1>
            ((Moira *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,
                                              in_stack_ffffffffffffffe0.raw)),
             in_stack_ffffffffffffffde,in_stack_ffffffffffffffd0);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  align.raw = in_RDI[1].pc;
  pSVar1 = StrWriter::operator<<(pSVar1,align);
  pSVar1 = StrWriter::operator<<(pSVar1,in_stack_ffffffffffffffe0);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<((StrWriter *)CONCAT44(align.raw,in_stack_ffffffffffffffe0.raw),in_RDI);
  return;
}

Assistant:

void
Moira::dasmAndRgEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}